

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O1

bool __thiscall glslang::TSymbolTable::isFunctionNameVariable(TSymbolTable *this,TString *name)

{
  bool bVar1;
  long lVar2;
  bool variable;
  bool local_29;
  
  if (this->separateNameSpaces == false) {
    lVar2 = (long)(int)((ulong)((long)(this->table).
                                      super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->table).
                                     super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
    do {
      bVar1 = TSymbolTableLevel::findFunctionVariableName
                        ((this->table).
                         super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar2 + -2],name,&local_29);
      if (bVar1) goto LAB_0039d6a4;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  local_29 = false;
LAB_0039d6a4:
  return (bool)(local_29 & 1);
}

Assistant:

bool isFunctionNameVariable(const TString& name) const
    {
        if (separateNameSpaces)
            return false;

        int level = currentLevel();
        do {
            bool variable;
            bool found = table[level]->findFunctionVariableName(name, variable);
            if (found)
                return variable;
            --level;
        } while (level >= 0);

        return false;
    }